

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_add_path(plutovg_path_t *path,plutovg_path_t *source,plutovg_matrix_t *matrix)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  plutovg_path_command_t pVar9;
  plutovg_path_element_t *ppVar10;
  plutovg_path_element_t *ppVar11;
  int iVar12;
  plutovg_point_t points [3];
  plutovg_path_iterator_t it;
  
  if (matrix == (plutovg_matrix_t *)0x0) {
    ppVar10 = (source->elements).data;
    if ((ppVar10 != (plutovg_path_element_t *)0x0) && (iVar12 = (source->elements).size, 0 < iVar12)
       ) {
      iVar7 = (path->elements).size;
      iVar8 = (path->elements).capacity;
      if (iVar8 < iVar7 + iVar12) {
        iVar6 = 8;
        if (iVar8 != 0) {
          iVar6 = iVar8;
        }
        do {
          iVar8 = iVar6;
          iVar6 = iVar8 * 2;
        } while (iVar8 < iVar7 + iVar12);
        ppVar11 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar8 << 3);
        (path->elements).data = ppVar11;
        (path->elements).capacity = iVar8;
        iVar7 = (path->elements).size;
        ppVar10 = (source->elements).data;
        iVar12 = (source->elements).size;
      }
      else {
        ppVar11 = (path->elements).data;
      }
      memcpy(ppVar11 + iVar7,ppVar10,(long)iVar12 << 3);
      piVar1 = &(path->elements).size;
      *piVar1 = *piVar1 + (source->elements).size;
    }
    path->start_point = source->start_point;
    uVar2 = source->num_points;
    uVar4 = source->num_contours;
    uVar3 = path->num_points;
    uVar5 = path->num_contours;
    path->num_points = uVar3 + uVar2;
    path->num_contours = uVar5 + uVar4;
    path->num_curves = path->num_curves + source->num_curves;
  }
  else {
    it.elements = (source->elements).data;
    iVar12 = (source->elements).size;
    it.index = 0;
    iVar7 = (path->elements).size + iVar12;
    iVar8 = (path->elements).capacity;
    it.size = iVar12;
    if (iVar8 < iVar7) {
      iVar6 = 8;
      if (iVar8 != 0) {
        iVar6 = iVar8;
      }
      do {
        iVar8 = iVar6;
        iVar6 = iVar8 * 2;
      } while (iVar8 < iVar7);
      ppVar10 = (plutovg_path_element_t *)realloc((path->elements).data,(long)iVar8 << 3);
      (path->elements).data = ppVar10;
      (path->elements).capacity = iVar8;
    }
    iVar8 = 0;
    while (iVar8 < iVar12) {
      pVar9 = plutovg_path_iterator_next(&it,points);
      iVar12 = it.size;
      iVar8 = it.index;
      switch(pVar9) {
      case PLUTOVG_PATH_COMMAND_MOVE_TO:
        plutovg_matrix_map_points(matrix,points,points,1);
        plutovg_path_move_to(path,points[0].x,points[0].y);
        iVar12 = it.size;
        iVar8 = it.index;
        break;
      case PLUTOVG_PATH_COMMAND_LINE_TO:
        plutovg_matrix_map_points(matrix,points,points,1);
        plutovg_path_line_to(path,points[0].x,points[0].y);
        iVar12 = it.size;
        iVar8 = it.index;
        break;
      case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        plutovg_matrix_map_points(matrix,points,points,3);
        plutovg_path_cubic_to
                  (path,points[0].x,points[0].y,points[1].x,points[1].y,points[2].x,points[2].y);
        iVar12 = it.size;
        iVar8 = it.index;
        break;
      case PLUTOVG_PATH_COMMAND_CLOSE:
        plutovg_path_close(path);
        iVar12 = it.size;
        iVar8 = it.index;
      }
    }
  }
  return;
}

Assistant:

void plutovg_path_add_path(plutovg_path_t* path, const plutovg_path_t* source, const plutovg_matrix_t* matrix)
{
    if(matrix == NULL) {
        plutovg_array_append(path->elements, source->elements);
        path->start_point = source->start_point;
        path->num_points += source->num_points;
        path->num_contours += source->num_contours;
        path->num_curves += source->num_curves;
        return;
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, source);

    plutovg_point_t points[3];
    plutovg_array_ensure(path->elements, source->elements.size);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_move_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            plutovg_path_line_to(path, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            plutovg_path_cubic_to(path, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_path_close(path);
            break;
        }
    }
}